

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O2

void __thiscall QTextHtmlParser::dumpHtml(QTextHtmlParser *this)

{
  QTextHtmlParserNode *pQVar1;
  int iVar2;
  QDebug *pQVar3;
  char *pcVar4;
  int i;
  long lVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char> local_78;
  undefined4 local_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  char *local_48;
  QDebug local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar5 = 0; lVar5 < (int)(this->nodes).d.size; lVar5 = lVar5 + 1) {
    local_60 = 2;
    local_5c = 0;
    uStack_54 = 0;
    local_4c = 0;
    local_48 = "default";
    QMessageLogger::debug();
    (local_40.stream)->space = false;
    iVar2 = depth(this,(int)lVar5);
    QString::QString((QString *)&local_90,(long)(iVar2 << 2),(QChar)0x20);
    QString::toLocal8Bit((QByteArray *)&local_78,(QString *)&local_90);
    pcVar4 = local_78.ptr;
    if (local_78.ptr == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    pQVar3 = QDebug::operator<<(&local_40,pcVar4);
    QString::toLocal8Bit((QByteArray *)&local_a8,&(this->nodes).d.ptr[lVar5]->tag);
    pcVar4 = local_a8.ptr;
    if (local_a8.ptr == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    pQVar3 = QDebug::operator<<(pQVar3,pcVar4);
    pQVar3 = QDebug::operator<<(pQVar3,':');
    pQVar1 = (this->nodes).d.ptr[lVar5];
    local_c0.d = (pQVar1->text).d.d;
    local_c0.ptr = (pQVar1->text).d.ptr;
    local_c0.size = (pQVar1->text).d.size;
    if (local_c0.d != (Data *)0x0) {
      LOCK();
      ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QString::replace((QChar)(char16_t)&local_c0,(QLatin1String *)0xa,2);
    QDebug::operator<<(pQVar3,(QString *)&local_c0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    QDebug::~QDebug(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlParser::dumpHtml()
{
    for (int i = 0; i < count(); ++i) {
        qDebug().nospace() << qPrintable(QString(depth(i) * 4, u' '))
                           << qPrintable(at(i).tag) << ':'
                           << quoteNewline(at(i).text);
    }
}